

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

crnd_unpack_context crnd::crnd_unpack_begin(void *pData,uint32 data_size)

{
  uint uVar1;
  crn_unpacker *p;
  uint32 data_size_local;
  void *pData_local;
  
  if ((pData == (void *)0x0) || (data_size < 0x3e)) {
    pData_local = (void *)0x0;
  }
  else {
    pData_local = crnd_new<crnd::crn_unpacker>();
    if ((crn_unpacker *)pData_local == (crn_unpacker *)0x0) {
      pData_local = (void *)0x0;
    }
    else {
      uVar1 = crn_unpacker::init((crn_unpacker *)pData_local,(EVP_PKEY_CTX *)pData);
      if ((uVar1 & 1) == 0) {
        crnd_delete<crnd::crn_unpacker>((crn_unpacker *)pData_local);
        pData_local = (void *)0x0;
      }
    }
  }
  return pData_local;
}

Assistant:

crnd_unpack_context crnd_unpack_begin(const void* pData, uint32 data_size)
    {
        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return NULL;

        crn_unpacker* p = crnd_new<crn_unpacker>();
        if (!p)
            return NULL;

        if (!p->init(pData, data_size))
        {
            crnd_delete(p);
            return NULL;
        }

        return p;
    }